

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost12sum.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  char **in_RSI;
  int in_EDI;
  bool bVar3;
  char sum_2 [129];
  char sum_1 [129];
  char *end;
  char filename_1 [4097];
  char sum [129];
  int error;
  int expected_hash_size;
  int count;
  int failcount;
  char filename [4096];
  char calcsum [129];
  char inhash [129];
  gost2012_hash_ctx ctx;
  int hashsize;
  int filenames_from_stdin;
  FILE *check_file;
  int open_mode;
  int errors;
  int verbose;
  int i;
  int c;
  int in_stack_0003dbc4;
  char *in_stack_0003dbc8;
  int in_stack_0003dbd4;
  gost2012_hash_ctx *in_stack_0003dbd8;
  ulong in_stack_ffffffffffffdbc0;
  char *in_stack_ffffffffffffdbc8;
  char *in_stack_ffffffffffffdbd0;
  gost2012_hash_ctx *in_stack_ffffffffffffdbd8;
  int *in_stack_ffffffffffffdbe8;
  int in_stack_ffffffffffffdbf4;
  char *in_stack_ffffffffffffdbf8;
  char *in_stack_ffffffffffffdc00;
  FILE *in_stack_ffffffffffffdc08;
  undefined1 local_23a8 [136];
  char *local_2320;
  char local_2318 [4112];
  undefined1 local_1308 [144];
  int local_1278;
  int local_1274;
  uint local_1270;
  uint local_126c;
  undefined1 local_1268 [4096];
  char local_268 [144];
  char local_1d8 [416];
  undefined4 local_38;
  int local_34;
  FILE *local_30;
  undefined4 local_24;
  uint local_20;
  int local_1c;
  int local_18;
  int local_14;
  char **local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_1c = 0;
  local_20 = 0;
  local_24 = 0;
  local_30 = (FILE *)0x0;
  local_34 = 0;
  local_38 = 0x20;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_14 = getopt(local_8,local_10,"hxlvc::"), local_14 != -1) {
    in_stack_ffffffffffffdbc0 = (ulong)(local_14 - 99);
    switch(in_stack_ffffffffffffdbc0) {
    case 0:
      if (_optarg == (char *)0x0) {
        local_30 = _stdin;
      }
      else {
        local_30 = fopen(_optarg,"r");
        if (local_30 == (FILE *)0x0) {
          perror(_optarg);
          exit(2);
        }
      }
      break;
    default:
      fprintf(_stderr,"invalid option %c\n",(ulong)_optopt);
      help();
      break;
    case 5:
      help();
      exit(0);
    case 9:
      local_38 = 0x40;
      break;
    case 0x13:
      local_1c = 1;
      break;
    case 0x15:
      local_34 = 1;
    }
  }
  if (local_30 == (FILE *)0x0) {
    if (local_34 == 0) {
      if (_optind == local_8) {
        fileno(_stdin);
        iVar1 = hash_stream(in_stack_0003dbd8,in_stack_0003dbd4,in_stack_0003dbc8,in_stack_0003dbc4)
        ;
        if (iVar1 == 0) {
          perror("stdin");
          exit(1);
        }
        printf("%s -\n",local_23a8);
        exit(0);
      }
      local_14 = 0xffffffff;
      for (local_18 = _optind; local_18 < local_8; local_18 = local_18 + 1) {
        iVar1 = hash_file(in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbd0,
                          in_stack_ffffffffffffdbc8,(int)(in_stack_ffffffffffffdbc0 >> 0x20),
                          (int)in_stack_ffffffffffffdbc0);
        if (iVar1 == 0) {
          local_20 = local_20 + 1;
        }
        else {
          printf("%s %s\n",&stack0xffffffffffffdbc8,local_10[local_18]);
        }
      }
    }
    else {
      local_14 = 0xffffffff;
      while ((iVar1 = feof(_stdin), iVar1 == 0 &&
             (pcVar2 = fgets(local_2318,0x1000,_stdin), pcVar2 != (char *)0x0))) {
        for (local_2320 = local_2318; *local_2320 != '\0'; local_2320 = local_2320 + 1) {
        }
        while( true ) {
          local_2320 = local_2320 + -1;
          bVar3 = true;
          if (*local_2320 != '\n') {
            bVar3 = *local_2320 == '\r';
          }
          if (!bVar3) break;
          *local_2320 = '\0';
        }
        iVar1 = hash_file(in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbd0,
                          in_stack_ffffffffffffdbc8,(int)(in_stack_ffffffffffffdbc0 >> 0x20),
                          (int)in_stack_ffffffffffffdbc0);
        if (iVar1 == 0) {
          local_20 = local_20 + 1;
        }
        else {
          printf("%s %s\n",local_1308,local_2318);
        }
      }
    }
    exit((uint)(local_20 != 0));
  }
  local_126c = 0;
  local_1270 = 0;
  local_1274 = 0;
  if (((local_30 == _stdin) && (_optind < local_8)) &&
     (local_30 = fopen(local_10[_optind],"r"), local_30 == (FILE *)0x0)) {
    perror(local_10[_optind]);
    exit(2);
  }
  while (iVar1 = get_line(in_stack_ffffffffffffdc08,in_stack_ffffffffffffdc00,
                          in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf4,
                          in_stack_ffffffffffffdbe8), iVar1 != 0) {
    local_1278 = 0;
    if (local_1274 == 0) {
      fprintf(_stderr,"%s: invalid hash length\n",local_1268);
      local_20 = local_20 + 1;
      local_1270 = local_1270 + 1;
    }
    else {
      iVar1 = hash_file(in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbd0,
                        in_stack_ffffffffffffdbc8,(int)(in_stack_ffffffffffffdbc0 >> 0x20),
                        (int)in_stack_ffffffffffffdbc0);
      if (iVar1 == 0) {
        local_20 = local_20 + 1;
        local_1278 = 1;
      }
      local_1270 = local_1270 + 1;
      if (local_1278 == 0) {
        iVar1 = strncmp(local_268,local_1d8,(long)(local_1274 * 2 + 1));
        if (iVar1 == 0) {
          if (local_1c != 0) {
            fprintf(_stderr,"%s\tOK\n",local_1268);
          }
        }
        else {
          if (local_1c == 0) {
            fprintf(_stderr,"%s: GOST hash sum check failed\n",local_1268);
          }
          else {
            fprintf(_stderr,"%s\tFAILED\n",local_1268);
          }
          local_126c = local_126c + 1;
        }
      }
    }
  }
  if (local_20 != 0) {
    fprintf(_stderr,"%s: WARNING %d of %d file(s) cannot be processed\n",*local_10,(ulong)local_20,
            (ulong)local_1270);
  }
  if (local_126c != 0) {
    fprintf(_stderr,"%s: WARNING %d of %d processed file(s) failed GOST hash sum check\n",*local_10,
            (ulong)local_126c,(ulong)(local_1270 - local_20));
  }
  exit((uint)(local_126c != 0 || local_20 != 0));
}

Assistant:

int main(int argc, char **argv)
{
    int c, i;
    int verbose = 0;
    int errors = 0;
    int open_mode = O_RDONLY | O_BINARY;
    FILE *check_file = NULL;
    int filenames_from_stdin = 0;
    int hashsize = 32;
    gost_hash_ctx ctx;

    while ((c = getopt(argc, argv, "hxlvc::")) != -1) {
        switch (c) {
        case 'h':
            help();
            exit(0);
            break;
        case 'v':
            verbose = 1;
            break;
        case 'l':
            hashsize = 64;
            break;
        case 'x':
            filenames_from_stdin = 1;
            break;
        case 'c':
            if (optarg) {
                check_file = fopen(optarg, "r");
                if (!check_file) {
                    perror(optarg);
                    exit(2);
                }
            } else {
                check_file = stdin;
            }
            break;
        default:
            fprintf(stderr, "invalid option %c\n", optopt);
            help();
        }
    }

    if (check_file) {
        char inhash[MAX_HASH_TXT_BYTES + 1], calcsum[MAX_HASH_TXT_BYTES + 1],
            filename[PATH_MAX];
        int failcount = 0, count = 0;
        int expected_hash_size = 0;
        if (check_file == stdin && optind < argc) {
            check_file = fopen(argv[optind], "r");
            if (!check_file) {
                perror(argv[optind]);
                exit(2);
            }
        }
        while (get_line
               (check_file, inhash, filename, verbose, &expected_hash_size)) {
            int error = 0;
            if (expected_hash_size == 0) {
                fprintf(stderr, "%s: invalid hash length\n", filename);
                errors++;
                count++;
                continue;
            }

            if (!hash_file
                (&ctx, filename, calcsum, open_mode, expected_hash_size)) {
                errors++;
                error = 1;
            }
            count++;
            if (error)
                continue;

            if (!strncmp(calcsum, inhash, expected_hash_size * 2 + 1)) {
                if (verbose) {
                    fprintf(stderr, "%s\tOK\n", filename);
                }
            } else {
                if (verbose) {
                    fprintf(stderr, "%s\tFAILED\n", filename);
                } else {
                    fprintf(stderr, "%s: GOST hash sum check failed\n",
                            filename);
                }
                failcount++;
            }
        }
        if (errors) {
            fprintf(stderr,
                    "%s: WARNING %d of %d file(s) cannot be processed\n",
                    argv[0], errors, count);

        }
        if (failcount) {
            fprintf(stderr,
                    "%s: WARNING %d of %d processed file(s) failed GOST hash sum check\n",
                    argv[0], failcount, count - errors);
        }
        exit((failcount || errors) ? 1 : 0);
    } else if (filenames_from_stdin) {
        char sum[MAX_HASH_TXT_BYTES + 1];
        char filename[PATH_MAX + 1], *end;
        while (!feof(stdin)) {
            if (!fgets(filename, PATH_MAX, stdin))
                break;
            for (end = filename; *end; end++) ;
            end--;
            for (; *end == '\n' || *end == '\r'; end--)
                *end = 0;
            if (!hash_file(&ctx, filename, sum, open_mode, hashsize)) {
                errors++;
            } else {
                printf("%s %s\n", sum, filename);
            }
        }

    } else if (optind == argc) {
        char sum[MAX_HASH_TXT_BYTES + 1];
        if (!hash_stream(&ctx, fileno(stdin), sum, hashsize)) {
            perror("stdin");
            exit(1);
        }
        printf("%s -\n", sum);
        exit(0);
    } else {
        for (i = optind; i < argc; i++) {
            char sum[MAX_HASH_TXT_BYTES + 1];
            if (!hash_file(&ctx, argv[i], sum, open_mode, hashsize)) {
                errors++;
            } else {
                printf("%s %s\n", sum, argv[i]);
            }
        }
    }
    exit(errors ? 1 : 0);
}